

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  _Rb_tree_node_base *p_Var2;
  ostringstream *poVar3;
  ostream *poVar4;
  Precision PVar5;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar6;
  Statement *pSVar7;
  ShaderExecutor *pSVar8;
  Variable<tcu::Vector<float,_3>_> *pVVar9;
  pointer pcVar10;
  pointer pVVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  _Rb_tree_node_base *p_Var15;
  long lVar16;
  long lVar17;
  IVal *pIVar18;
  undefined8 *puVar19;
  Vector<float,_3> *val;
  MessageBuilder *pMVar20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  FloatFormat *pFVar23;
  TestStatus *pTVar24;
  byte bVar25;
  IVal reference1;
  IVal in2;
  FuncSet funcs;
  IVal in3;
  Environment env;
  IVal in0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void>_> outputs;
  void *outputArr [2];
  FloatFormat highpFmt;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffaa8;
  IVal local_551;
  undefined1 local_550 [12];
  undefined4 uStack_544;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  TestLog *local_530;
  size_t local_528;
  undefined1 local_520 [16];
  undefined1 local_510 [24];
  double local_4f8;
  double local_4d8;
  FloatFormat *local_4d0;
  TestStatus *local_4c8;
  string local_4c0;
  long local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  undefined1 local_468 [16];
  IVal local_458;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void>_>
  local_2e8;
  pointer local_2b8;
  pointer local_2b0;
  FloatFormat local_2a8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  IVal local_1a8;
  ios_base local_138 [264];
  
  bVar25 = 0;
  this_00 = this->m_samplings;
  pFVar23 = &(this->m_caseCtx).floatFormat;
  PVar5 = (this->m_caseCtx).precision;
  sVar6 = (this->m_caseCtx).numRandoms;
  local_4c8 = __return_storage_ptr__;
  iVar13 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4d0 = pFVar23;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar23,(FloatFormat *)(ulong)PVar5,(Precision)sVar6,(ulong)(iVar13 + 0xdeadbeef),
             in_stack_fffffffffffffaa8);
  pVVar11 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_528 = ((long)local_278.in0.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_278.in0.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_2e8,local_528);
  local_2a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_530 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = local_2e8.out0.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_2b0 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_468 + 8);
  local_468._0_8_ = local_530;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_520 + 8);
  local_520._8_4_ = _S_red;
  local_510._0_8_ = (_Base_ptr)0x0;
  local_4f8 = 0.0;
  pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_510._8_8_ = p_Var2;
  local_510._16_8_ = p_Var2;
  (*pSVar7->_vptr_Statement[4])(pSVar7,local_520);
  if ((_Rb_tree_node_base *)local_510._8_8_ != p_Var2) {
    p_Var15 = (_Rb_tree_node_base *)local_510._8_8_;
    do {
      (**(code **)(**(long **)(p_Var15 + 1) + 0x30))(*(long **)(p_Var15 + 1),&local_1a8);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != p_Var2);
  }
  if (local_4f8 != 0.0) {
    poVar3 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_530;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)local_550._0_8_,CONCAT44(uStack_544,local_550._8_4_));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._0_8_ != &local_540) {
      operator_delete((void *)local_550._0_8_,local_540._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_520);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar8 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,local_528,&local_218,&local_2b8,0);
  lVar16 = 8;
  do {
    local_468[lVar16 + -8] = 0;
    *(undefined8 *)(local_468 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_468 + lVar16 + 8) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x50);
  lVar16 = 8;
  do {
    local_468[lVar16 + -8] = 0;
    *(undefined8 *)(local_468 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_468 + lVar16 + 8) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x50);
  lVar16 = 8;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar16 + -8) = 0;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x50);
  lVar16 = 8;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar16 + -8) = 0;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x50);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_498,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_520);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_550);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c0);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_498,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             &local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_551);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar11) {
LAB_008774e2:
    poVar3 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_530;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    pTVar24 = local_4c8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3f0);
    local_468._0_8_ = (IVal *)(local_468 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    pTVar24->m_code = QP_TEST_RESULT_PASS;
    (pTVar24->m_description)._M_dataplus._M_p = (pointer)&(pTVar24->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar24->m_description,local_468._0_8_,
               (long)&((Interval *)local_468._0_8_)->m_hasNaN +
               CONCAT44(local_468._12_4_,local_468._8_4_));
    if ((IVal *)local_468._0_8_ == (IVal *)(local_468 + 0x10)) goto LAB_008776c9;
    p_Var21 = (_Base_ptr)CONCAT44(local_458.m_data[0]._4_4_,local_458.m_data[0]._0_4_);
    pIVar18 = (IVal *)local_468._0_8_;
  }
  else {
    local_4a0 = local_528 + (local_528 == 0);
    lVar16 = 0;
    local_4d8 = 0.0;
    pFVar23 = local_4d0;
    do {
      lVar17 = 8;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar17 + -8) = 0;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar17) = 0x7ff0000000000000;
        *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x50);
      lVar17 = 8;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar17 + -8) = 0;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar17) = 0x7ff0000000000000;
        *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x50);
      local_550._8_4_ =
           local_278.in0.
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar16].m_data[2];
      local_550._0_8_ =
           *(undefined8 *)
            local_278.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar16].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_520,pFVar23,(Vector<float,_3> *)local_550);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_468,pFVar23,(IVal *)local_520);
      pIVar18 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_498,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar20 = (MessageBuilder *)local_468;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(TestLog **)pIVar18->m_data = pMVar20->m_log;
        pMVar20 = (MessageBuilder *)((long)pMVar20 + (ulong)bVar25 * -0x10 + 8);
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_458.m_data[1]._0_4_ = (this->m_caseCtx).precision;
      local_458.m_data[0].m_hi = pFVar23->m_maxValue;
      local_468._0_8_ = *(undefined8 *)pFVar23;
      local_468._8_4_ = pFVar23->m_fractionBits;
      local_468._12_4_ = pFVar23->m_hasSubnormal;
      local_458.m_data[0]._0_4_ = pFVar23->m_hasInf;
      local_458.m_data[0]._4_4_ = pFVar23->m_hasNaN;
      local_458.m_data[0].m_lo._0_1_ = pFVar23->m_exactPrecision;
      local_458.m_data[0].m_lo._1_3_ = *(undefined3 *)&pFVar23->field_0x19;
      local_458.m_data[0].m_lo._4_4_ = *(undefined4 *)&pFVar23->field_0x1c;
      local_458.m_data[1].m_hi._0_4_ = 0;
      pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_458.m_data[1].m_lo = (double)&local_498;
      (*pSVar7->_vptr_Statement[3])(pSVar7,(MessageBuilder *)local_468);
      pIVar18 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_498,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_468,&local_2a8,pIVar18);
      pMVar20 = (MessageBuilder *)local_468;
      pIVar18 = &local_1a8;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(TestLog **)pIVar18->m_data = pMVar20->m_log;
        pMVar20 = (MessageBuilder *)((long)pMVar20 + (ulong)bVar25 * -0x10 + 8);
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      bVar12 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                         (&local_1a8,
                          local_2e8.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar16);
      local_468._0_8_ = local_468 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(&local_1f8,bVar12,(string *)local_468);
      if ((TestLog *)local_468._0_8_ != (TestLog *)(local_468 + 0x10)) {
        operator_delete((void *)local_468._0_8_,
                        CONCAT44(local_458.m_data[0]._4_4_,local_458.m_data[0]._0_4_) + 1);
      }
      pFVar23 = local_4d0;
      if ((!bVar12) &&
         (uVar14 = SUB84(local_4d8,0) + 1, local_4d8 = (double)(ulong)uVar14, (int)uVar14 < 0x65)) {
        local_468._0_8_ = local_530;
        poVar3 = (ostringstream *)(local_468 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar9 = (this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr
        ;
        val = (Vector<float,_3> *)local_510;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_520._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_520._0_8_,
                   CONCAT44(local_520._12_4_,local_520._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_550,(shaderexecutor *)&local_2a8,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar16),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_550._0_8_,
                   CONCAT44(uStack_544,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._0_8_ != &local_540) {
          operator_delete((void *)local_550._0_8_,local_540._M_allocated_capacity + 1);
        }
        if ((Vector<float,_3> *)local_520._0_8_ != (Vector<float,_3> *)local_510) {
          operator_delete((void *)local_520._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_510._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar9 = (this->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr
        ;
        pIVar18 = (IVal *)local_510;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_520._0_8_ = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_520._0_8_,
                   CONCAT44(local_520._12_4_,local_520._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_550,(shaderexecutor *)&local_2a8,
                   (FloatFormat *)
                   (local_2e8.out0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar16),(Vector<float,_3> *)pIVar18)
        ;
        poVar4 = (ostream *)(local_468 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_550._0_8_,CONCAT44(uStack_544,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,3>>
                  (&local_4c0,(shaderexecutor *)&local_2a8,(FloatFormat *)&local_1a8,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),local_4c0._M_dataplus._M_p,local_4c0._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._0_8_ != &local_540) {
          operator_delete((void *)local_550._0_8_,local_540._M_allocated_capacity + 1);
        }
        if ((IVal *)local_520._0_8_ != (IVal *)local_510) {
          operator_delete((void *)local_520._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_510._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_468 + 8));
        std::ios_base::~ios_base(local_3f0);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != local_4a0);
    iVar13 = SUB84(local_4d8,0);
    if (iVar13 < 0x65) {
      if (iVar13 == 0) goto LAB_008774e2;
    }
    else {
      poVar3 = (ostringstream *)(local_468 + 8);
      local_468._0_8_ = local_530;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
      std::ostream::operator<<(poVar3,iVar13 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_3f0);
    }
    poVar3 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_530;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    std::ostream::operator<<(local_468,iVar13);
    pTVar24 = local_4c8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::ios_base::~ios_base(local_3f8);
    local_468._0_8_ = local_468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468," test failed. Check log for the details","");
    p_Var21 = (_Base_ptr)
              (CONCAT44(local_468._12_4_,local_468._8_4_) +
              CONCAT44(local_520._12_4_,local_520._8_4_));
    p_Var22 = (_Base_ptr)0xf;
    if ((IVal *)local_520._0_8_ != (IVal *)local_510) {
      p_Var22 = (_Base_ptr)local_510._0_8_;
    }
    if (p_Var22 < p_Var21) {
      p_Var22 = (_Base_ptr)0xf;
      if ((IVal *)local_468._0_8_ != (IVal *)(local_468 + 0x10)) {
        p_Var22 = (_Base_ptr)CONCAT44(local_458.m_data[0]._4_4_,local_458.m_data[0]._0_4_);
      }
      if (p_Var22 < p_Var21) goto LAB_008774d3;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_468,0,(char *)0x0,local_520._0_8_);
    }
    else {
LAB_008774d3:
      puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_520,local_468._0_8_);
    }
    local_1a8.m_data[0]._0_8_ = &local_1a8.m_data[0].m_hi;
    pdVar1 = (double *)(puVar19 + 2);
    if ((double *)*puVar19 == pdVar1) {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[1]._0_4_ = *(undefined4 *)(puVar19 + 3);
      local_1a8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar19 + 0x1c);
    }
    else {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[0]._0_8_ = (double *)*puVar19;
    }
    local_1a8.m_data[0].m_lo = (double)puVar19[1];
    *puVar19 = pdVar1;
    puVar19[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar24->m_code = QP_TEST_RESULT_FAIL;
    (pTVar24->m_description)._M_dataplus._M_p = (pointer)&(pTVar24->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar24->m_description,local_1a8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1a8.m_data[0].m_lo + local_1a8.m_data[0]._0_8_));
    if ((double *)local_1a8.m_data[0]._0_8_ != &local_1a8.m_data[0].m_hi) {
      operator_delete((void *)local_1a8.m_data[0]._0_8_,(long)local_1a8.m_data[0].m_hi + 1);
    }
    if ((IVal *)local_468._0_8_ != (IVal *)(local_468 + 0x10)) {
      operator_delete((void *)local_468._0_8_,
                      CONCAT44(local_458.m_data[0]._4_4_,local_458.m_data[0]._0_4_) + 1);
    }
    p_Var21 = (_Base_ptr)local_510._0_8_;
    pIVar18 = (IVal *)local_520._0_8_;
    if ((IVal *)local_520._0_8_ == (IVal *)local_510) goto LAB_008776c9;
  }
  operator_delete(pIVar18,(ulong)((long)&p_Var21->_M_color + 1));
LAB_008776c9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar24;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}